

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::opt::AggressiveDCEPass::GetLoadedVariables
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          AggressiveDCEPass *this,Instruction *inst)

{
  uint32_t local_c;
  
  if (inst->opcode_ == OpFunctionCall) {
    GetLoadedVariablesFromFunctionCall(__return_storage_ptr__,this,inst);
  }
  else {
    local_c = GetLoadedVariableFromNonFunctionCalls(this,inst);
    if (local_c == 0) {
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_initialize<unsigned_int_const*>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                 &local_c);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> AggressiveDCEPass::GetLoadedVariables(Instruction* inst) {
  if (inst->opcode() == spv::Op::OpFunctionCall) {
    return GetLoadedVariablesFromFunctionCall(inst);
  }
  uint32_t var_id = GetLoadedVariableFromNonFunctionCalls(inst);
  if (var_id == 0) {
    return {};
  }
  return {var_id};
}